

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_load_image_from_hdr_file_data_to_buffer
          (rf_image *__return_storage_ptr__,void *src,rf_int src_size,void *dst,rf_int dst_size,
          rf_desired_channels channels,rf_allocator temp_allocator)

{
  long lVar1;
  rf_source_location source_location;
  rf_source_location rVar2;
  rf_source_location source_location_00;
  rf_allocator_args rVar3;
  int iVar4;
  stbi_uc *__src;
  long *in_FS_OFFSET;
  undefined4 uStack_114;
  undefined4 uStack_dc;
  uint uStack_ac;
  undefined4 uStack_74;
  int output_buffer_size;
  void *output_buffer;
  int img_bpp;
  int img_height;
  int img_width;
  rf_desired_channels channels_local;
  rf_int dst_size_local;
  void *dst_local;
  rf_int src_size_local;
  void *src_local;
  
  img_height = channels;
  _img_width = dst_size;
  dst_size_local = (rf_int)dst;
  dst_local = (void *)src_size;
  src_size_local = (rf_int)src;
  memset(__return_storage_ptr__,0,0x18);
  if ((src_size_local == 0) || ((long)dst_local < 1)) {
    rf_log_impl(8,0x1b2691,(char *)0x1);
    lVar1 = *in_FS_OFFSET;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_load_image_from_hdr_file_data_to_buffer";
    *(undefined8 *)(lVar1 + -0x450) = 0x3ccf;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_114,1);
  }
  else {
    img_bpp = 0;
    output_buffer._4_4_ = 0;
    output_buffer._0_4_ = 0;
    lVar1 = *in_FS_OFFSET;
    *(void **)(lVar1 + -0x440) = temp_allocator.user_data;
    *(rf_allocator_proc **)(lVar1 + -0x438) = temp_allocator.allocator_proc;
    __src = stbi_load_from_memory
                      ((stbi_uc *)src_size_local,(int)dst_local,&img_bpp,
                       (int *)((long)&output_buffer + 4),(int *)&output_buffer,img_height);
    lVar1 = *in_FS_OFFSET;
    *(undefined8 *)(lVar1 + -0x440) = 0;
    *(undefined8 *)(lVar1 + -0x438) = 0;
    if (__src == (stbi_uc *)0x0) {
      source_location_00.proc_name = "rf_load_image_from_hdr_file_data_to_buffer";
      source_location_00.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location_00.line_in_file = 0x3ccd;
      rf_log_impl(source_location_00,RF_LOG_TYPE_ERROR,
                  "File format not supported or could not be loaded. STB Image returned { x: %d, y: %d, channels: %d }"
                  ,7,(ulong)(uint)img_bpp,(ulong)output_buffer._4_4_,(ulong)(uint)output_buffer);
      lVar1 = *in_FS_OFFSET;
      *(char **)(lVar1 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar1 + -0x458) = "rf_load_image_from_hdr_file_data_to_buffer";
      *(undefined8 *)(lVar1 + -0x450) = 0x3ccd;
      *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_dc,7);
    }
    else {
      iVar4 = img_bpp * output_buffer._4_4_ * (uint)output_buffer;
      if (_img_width < iVar4) {
        source_location.proc_name = "rf_load_image_from_hdr_file_data_to_buffer";
        source_location.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        source_location.line_in_file = 0x3cc9;
        rf_log_impl(source_location,RF_LOG_TYPE_ERROR,"Buffer is not big enough",1,
                    (ulong)(uint)img_bpp,(ulong)output_buffer._4_4_,(ulong)(uint)output_buffer);
        lVar1 = *in_FS_OFFSET;
        *(char **)(lVar1 + -0x460) =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        *(char **)(lVar1 + -0x458) = "rf_load_image_from_hdr_file_data_to_buffer";
        *(undefined8 *)(lVar1 + -0x450) = 0x3cc9;
        *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_74,1);
      }
      else {
        __return_storage_ptr__->data = (void *)dst_size_local;
        __return_storage_ptr__->width = img_bpp;
        __return_storage_ptr__->height = output_buffer._4_4_;
        __return_storage_ptr__->valid = true;
        if ((uint)output_buffer == 1) {
          __return_storage_ptr__->format = RF_UNCOMPRESSED_R32;
        }
        else if ((uint)output_buffer == 3) {
          __return_storage_ptr__->format = RF_UNCOMPRESSED_R32G32B32;
        }
        else if ((uint)output_buffer == 4) {
          __return_storage_ptr__->format = RF_UNCOMPRESSED_NORMALIZED;
        }
        memcpy((void *)dst_size_local,__src,(long)iVar4);
      }
      rVar2.proc_name = "rf_load_image_from_hdr_file_data_to_buffer";
      rVar2.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar2.line_in_file = 0x3ccb;
      rVar3.size_to_allocate_or_reallocate = 0;
      rVar3.pointer_to_free_or_realloc = __src;
      rVar3._16_8_ = (ulong)uStack_ac << 0x20;
      (*temp_allocator.allocator_proc)(&temp_allocator,rVar2,RF_AM_FREE,rVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_image_from_hdr_file_data_to_buffer(const void* src, rf_int src_size, void* dst, rf_int dst_size, rf_desired_channels channels, rf_allocator temp_allocator)
{
    rf_image result = {0};

    if (src && src_size > 0)
    {
        int img_width = 0, img_height = 0, img_bpp = 0;

        // NOTE: Using stb_image to load images (Supports multiple image formats)
        RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
        void* output_buffer = stbi_load_from_memory(src, src_size, &img_width, &img_height, &img_bpp, channels);
        RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

        if (output_buffer)
        {
            int output_buffer_size = img_width * img_height * img_bpp;

            if (dst_size >= output_buffer_size)
            {
                result.data   = dst;
                result.width  = img_width;
                result.height = img_height;
                result.valid  = true;

                     if (img_bpp == 1) result.format = RF_UNCOMPRESSED_R32;
                else if (img_bpp == 3) result.format = RF_UNCOMPRESSED_R32G32B32;
                else if (img_bpp == 4) result.format = RF_UNCOMPRESSED_R32G32B32A32;

                memcpy(dst, output_buffer, output_buffer_size);
            }
            else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Buffer is not big enough", img_width, img_height, img_bpp);

            RF_FREE(temp_allocator, output_buffer);
        }
        else RF_LOG_ERROR(RF_STBI_FAILED, "File format not supported or could not be loaded. STB Image returned { x: %d, y: %d, channels: %d }", img_width, img_height, img_bpp);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Argument `image` was invalid.");

    return result;
}